

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O3

void helper_sve_fcmla_zpzzz_d_aarch64(CPUARMState_conflict *env,void *vg,uint32_t desc)

{
  float_status *s;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  float64 fVar4;
  float64 fVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  uVar13 = (ulong)((desc & 0x1f) * 8 + 8);
  s = &(env->vfp).fp_status;
  lVar6 = (long)(env->vfp).zregs[0].d + ((ulong)(desc >> 7 & 0x1f00) - 8);
  uVar7 = (ulong)(desc >> 0xc & 0x1f00);
  uVar8 = (ulong)(desc >> 0x11 & 0x1f00);
  uVar9 = (ulong)(desc >> 2 & 0x1f00);
  do {
    uVar1 = *(ulong *)((long)vg + ((long)(uVar13 - 1) >> 6) * 8);
    uVar10 = uVar13;
    do {
      uVar13 = uVar10 - 0x10;
      bVar14 = (desc >> 0x1e & 1) != 0;
      uVar2 = *(ulong *)((long)(env->vfp).zregs[0].d + uVar10 + uVar7 + -0x10);
      lVar3 = lVar6 + -8;
      if (bVar14) {
        lVar3 = lVar6;
      }
      uVar11 = *(ulong *)((long)(env->vfp).zregs[0].d + uVar10 + uVar7 + -8);
      uVar12 = uVar2;
      if (!bVar14) {
        uVar12 = uVar11;
      }
      fVar5 = *(float64 *)(lVar3 + uVar10);
      if ((uVar1 >> ((uint)uVar13 & 0x3f) & 1) != 0) {
        if ((desc >> 0x1e & 1) == 0) {
          uVar11 = uVar2;
        }
        fVar4 = float64_muladd_aarch64
                          (fVar5,uVar11 ^ (ulong)((desc >> 0x1e) - 1 < 2) << 0x3f,
                           *(float64 *)((long)(env->vfp).zregs[0].d + uVar10 + uVar8 + -0x10),0,s);
        *(float64 *)((long)(env->vfp).zregs[0].d + uVar10 + uVar9 + -0x10) = fVar4;
      }
      if ((uVar1 >> (uVar10 - 8 & 0x3f) & 1) != 0) {
        fVar5 = float64_muladd_aarch64
                          (fVar5,uVar12 ^ (ulong)(desc >> 0x1f) << 0x3f,
                           *(float64 *)((long)(env->vfp).zregs[0].d + uVar10 + uVar8 + -8),0,s);
        *(float64 *)((long)(env->vfp).zregs[0].d + uVar10 + uVar9 + -8) = fVar5;
      }
      uVar10 = uVar13;
    } while ((uVar13 & 0x3f) != 0);
  } while (uVar13 != 0);
  return;
}

Assistant:

void HELPER(sve_fcmla_zpzzz_d)(CPUARMState *env, void *vg, uint32_t desc)
{
    intptr_t j, i = simd_oprsz(desc);
    unsigned rd = extract32(desc, SIMD_DATA_SHIFT, 5);
    unsigned rn = extract32(desc, SIMD_DATA_SHIFT + 5, 5);
    unsigned rm = extract32(desc, SIMD_DATA_SHIFT + 10, 5);
    unsigned ra = extract32(desc, SIMD_DATA_SHIFT + 15, 5);
    unsigned rot = extract32(desc, SIMD_DATA_SHIFT + 20, 2);
    bool flip = rot & 1;
    float64 neg_imag, neg_real;
    void *vd = &env->vfp.zregs[rd];
    void *vn = &env->vfp.zregs[rn];
    void *vm = &env->vfp.zregs[rm];
    void *va = &env->vfp.zregs[ra];
    uint64_t *g = vg;

    neg_imag = float64_set_sign(0, (rot & 2) != 0);
    neg_real = float64_set_sign(0, rot == 1 || rot == 2);

    do {
        uint64_t pg = g[(i - 1) >> 6];
        do {
            float64 e1, e2, e3, e4, nr, ni, mr, mi, d;

            /* I holds the real index; J holds the imag index.  */
            j = i - sizeof(float64);
            i -= 2 * sizeof(float64);

            nr = *(float64 *)((char *)vn + H1_2(i));
            ni = *(float64 *)((char *)vn + H1_2(j));
            mr = *(float64 *)((char *)vm + H1_2(i));
            mi = *(float64 *)((char *)vm + H1_2(j));

            e2 = (flip ? ni : nr);
            e1 = (flip ? mi : mr) ^ neg_real;
            e4 = e2;
            e3 = (flip ? mr : mi) ^ neg_imag;

            if (likely((pg >> (i & 63)) & 1)) {
                d = *(float64 *)((char *)va + H1_2(i));
                d = float64_muladd(e2, e1, d, 0, &env->vfp.fp_status);
                *(float64 *)((char *)vd + H1_2(i)) = d;
            }
            if (likely((pg >> (j & 63)) & 1)) {
                d = *(float64 *)((char *)va + H1_2(j));
                d = float64_muladd(e4, e3, d, 0, &env->vfp.fp_status);
                *(float64 *)((char *)vd + H1_2(j)) = d;
            }
        } while (i & 63);
    } while (i != 0);
}